

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

void __thiscall phosg::cannot_open_file::cannot_open_file(cannot_open_file *this,int fd)

{
  size_type *psVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint *puVar4;
  uint uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  int error;
  ulong uVar8;
  uint __val;
  undefined8 uVar9;
  uint __len;
  string __str;
  size_type *local_d0;
  size_type local_c8;
  size_type local_c0;
  undefined8 uStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __val = -fd;
  if (0 < fd) {
    __val = fd;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar5 = (uint)uVar8;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0011653a;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0011653a;
      }
      if (uVar5 < 10000) goto LAB_0011653a;
      uVar8 = uVar8 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0011653a:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)(__len + -(fd >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p + (uint)-(fd >> 0x1f),__len,__val);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_50,0,0,"can\'t open fd ",0xe);
  local_70._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar6 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar6) {
    local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70,": ");
  paVar6 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar7 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar7) {
    local_b0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)paVar6;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  puVar4 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&local_90,(phosg *)(ulong)*puVar4,error);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar6) {
    uVar9 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_90._M_string_length + local_b0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar9 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_b0._M_string_length <= (ulong)uVar9) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_90,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      goto LAB_0011669e;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b0,local_90._M_dataplus._M_p,local_90._M_string_length);
LAB_0011669e:
  local_d0 = &local_c0;
  psVar1 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar7 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar7) {
    local_c0 = paVar7->_M_allocated_capacity;
    uStack_b8 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_c0 = paVar7->_M_allocated_capacity;
    local_d0 = psVar1;
  }
  local_c8 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar3->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  ::std::runtime_error::runtime_error((runtime_error *)&this->field_0x10,(string *)&local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar6) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->_vptr_cannot_open_file = (_func_int **)0x138ae8;
  *(undefined8 *)&this->field_0x10 = 0x138b18;
  this->error = *puVar4;
  return;
}

Assistant:

cannot_open_file::cannot_open_file(int fd)
    : runtime_error("can\'t open fd " + to_string(fd) + ": " + string_for_error(errno)),
      error(errno) {}